

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

Environment * iutest::TestEnv::AddGlobalTestEnvironment(Environment *env)

{
  pointer *pppEVar1;
  iterator __position;
  Variable *pVVar2;
  Environment *in_RDI;
  Environment *local_8;
  
  if (in_RDI == (Environment *)0x0) {
    local_8 = (Environment *)0x0;
  }
  else {
    local_8 = in_RDI;
    pVVar2 = get_vars();
    __position._M_current =
         (pVVar2->m_environment_list).
         super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pVVar2->m_environment_list).
        super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>::
      _M_realloc_insert<iutest::Environment*const&>
                ((vector<iutest::Environment*,std::allocator<iutest::Environment*>> *)
                 &pVVar2->m_environment_list,__position,&local_8);
    }
    else {
      *__position._M_current = local_8;
      pppEVar1 = &(pVVar2->m_environment_list).
                  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  return local_8;
}

Assistant:

static Environment* AddGlobalTestEnvironment(Environment* env)
    {
        if( env == NULL )
        {
            return NULL;
        }
        environments().push_back(env);
        return env;
    }